

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * MyGame_Example_Color_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  char *pcVar1;
  ulong uVar2;
  uint64_t uVar3;
  
  if ((ulong)((long)end - (long)buf) < 8) {
    uVar2 = 0;
    switch((long)end - (long)buf) {
    case 7:
      uVar2 = (long)buf[6] << 8;
    case 6:
      uVar2 = uVar2 | (long)buf[5] << 0x10;
    case 5:
      uVar2 = uVar2 | (long)buf[4] << 0x18;
    case 4:
      uVar2 = uVar2 | (long)buf[3] << 0x20;
    case 3:
      uVar2 = uVar2 | (long)buf[2] << 0x28;
    case 2:
      uVar2 = uVar2 | (long)buf[1] << 0x30;
    case 1:
      uVar2 = (ulong)(byte)*buf << 0x38 | uVar2;
      break;
    default:
      goto switchD_0010dd5d_default;
    }
  }
  else {
    uVar2 = *(ulong *)buf;
    uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
            (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
            (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  }
  if (uVar2 < 0x477265656e000000) {
    if ((uVar2 & 0x7fffffff00000000) != 0x426c756500000000) {
      return buf;
    }
    pcVar1 = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (pcVar1 == buf) {
      return buf;
    }
    uVar3 = 8;
  }
  else if ((uint)(uVar2 >> 0x28) == 0x526564) {
    pcVar1 = flatcc_json_parser_match_constant(ctx,buf,end,3,aggregate);
    if (pcVar1 == buf) {
      return buf;
    }
    uVar3 = 1;
  }
  else {
    if ((uVar2 & 0xffffffffff000000) != 0x477265656e000000) {
      return buf;
    }
    pcVar1 = flatcc_json_parser_match_constant(ctx,buf,end,5,aggregate);
    if (pcVar1 == buf) {
      return buf;
    }
    uVar3 = 2;
  }
  *value = uVar3;
  *value_sign = 0;
  buf = pcVar1;
switchD_0010dd5d_default:
  return buf;
}

Assistant:

static const char *MyGame_Example_Color_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x477265656e000000) { /* branch "Green" */
        if ((w & 0xffffffff00000000) == 0x426c756500000000) { /* "Blue" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(8), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "Blue" */
            return unmatched;
        } /* "Blue" */
    } else { /* branch "Green" */
        if ((w & 0xffffff0000000000) == 0x5265640000000000) { /* "Red" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 3, aggregate);
            if (buf != mark) {
                *value = UINT64_C(1), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "Red" */
            if ((w & 0xffffffffff000000) == 0x477265656e000000) { /* "Green" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 5, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(2), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "Green" */
                return unmatched;
            } /* "Green" */
        } /* "Red" */
    } /* branch "Green" */
    return buf;
}